

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<unsigned_short,_true>::push_back
          (SmallVectorTemplateBase<unsigned_short,_true> *this,unsigned_short *Elt)

{
  uint uVar1;
  
  uVar1 = *(uint *)(this + 8);
  if (*(uint *)(this + 0xc) <= uVar1) {
    grow(this,0);
    uVar1 = *(uint *)(this + 8);
  }
  *(unsigned_short *)(*(long *)this + (ulong)uVar1 * 2) = *Elt;
  SmallVectorBase::set_size((SmallVectorBase *)this,(ulong)*(uint *)(this + 8) + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }